

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double planck_pdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 local_30;
  double pdf;
  double k;
  double b_local;
  double a_local;
  double x_local;
  
  if (0.0 <= x) {
    dVar1 = tgamma(b + 1.0);
    dVar2 = r8_zeta(b + 1.0);
    dVar3 = pow(a,b + 1.0);
    dVar4 = pow(x,b);
    dVar5 = exp(a * x);
    local_30 = ((dVar3 * dVar4) / (dVar5 - 1.0)) / (dVar1 * dVar2);
  }
  else {
    local_30 = 0.0;
  }
  return local_30;
}

Assistant:

double planck_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    PLANCK_PDF evaluates the Planck PDF.
//
//  Discussion:
//
//    The Planck PDF has the form
//
//      PDF(A,B;X) = A^(B+1) * X^B / ( exp ( A * X ) - 1 ) / K
//
//    where K is the normalization constant, and has the value
//
//      K = Gamma ( B + 1 ) * Zeta ( B + 1 ).
//
//    The original Planck distribution governed the frequencies in
//    blackbody radiation at a given temperature T, and has the form
//
//      PDF(A;X) = K * X^3 / ( exp ( A * X ) - 1 )
//
//    where
//
//      K = 15 / PI^4.
//
//    Thus, in terms of the Planck PDF, the original Planck distribution
//    has A = 1, B = 3.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double PLANCK_PDF, the value of the PDF.
//
{
  double k;
  double pdf;

  if ( x < 0.0 )
  {
    pdf = 0.0;
  }
  else
  {
    k = tgamma ( b + 1.0 ) * r8_zeta ( b + 1.0 );
    pdf = pow ( a, b + 1.0 ) * pow ( x, b ) / ( exp ( a * x ) - 1.0 ) / k;
  }

  return pdf;
}